

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtp-rb.c
# Opt level: O1

void rtp_rb_print_rb(void)

{
  uint uVar1;
  
  uVar1 = rtp_rb_start;
  if (rtp_rb_start != rtp_rb_end) {
    do {
      if (rtp_rb[uVar1].length != 0) {
        fprintf(_stderr,"%.3u: seq %.3u\n",(ulong)uVar1,(ulong)*(ushort *)&rtp_rb[uVar1].b.field_0x2
               );
      }
      uVar1 = (uVar1 + 1) % rtp_rb_size;
    } while (uVar1 != rtp_rb_end);
  }
  return;
}

Assistant:

void rtp_rb_print_rb(void) {
  unsigned int i;
  for (i = rtp_rb_start; i != rtp_rb_end; i = (i + 1) % rtp_rb_size) {
    if (rtp_rb[i].length != 0)
      fprintf(stderr, "%.3u: seq %.3u\n", i, rtp_rb[i].b.seq);
  }
}